

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<false> * __thiscall
ArrayState<false>::StartArray(ArrayState<false> *this,Context<false> *ctx)

{
  stringstream *psVar1;
  Namespace<false> *pNVar2;
  long in_RSI;
  BaseState<false> *in_RDI;
  Context<false> *unaff_retaddr;
  BaseState<false> *in_stack_00000060;
  char *in_stack_00000068;
  Context<false> *in_stack_00000070;
  BaseState<false> *local_8;
  
  if (*(BaseState<false> **)(in_RSI + 0x28) == in_RDI) {
    psVar1 = Context<false>::error_abi_cxx11_(unaff_retaddr);
    std::operator<<((ostream *)(psVar1 + 0x10),"Nested arrays are not supported");
    local_8 = (BaseState<false> *)0x0;
  }
  else {
    Context<false>::PushNamespace(in_stack_00000070,in_stack_00000068,in_stack_00000060);
    pNVar2 = Context<false>::CurrentNamespace((Context<false> *)0x2a6d01);
    in_RDI[1]._vptr_BaseState = (_func_int **)pNVar2->namespace_hash;
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

BaseState<audit>* StartArray(Context<audit>& ctx)
  {
    if (ctx.previous_state == this)
    {
      ctx.error() << "Nested arrays are not supported";
      return nullptr;
    }

    ctx.PushNamespace(ctx.key, ctx.previous_state);

    array_hash = ctx.CurrentNamespace().namespace_hash;

    return this;
  }